

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm2pes.h
# Opt level: O0

void __thiscall
libwebm::Webm2Pes::Webm2Pes(Webm2Pes *this,string *input_file,PacketReceiverInterface *packet_sink)

{
  PacketReceiverInterface *packet_sink_local;
  string *input_file_local;
  Webm2Pes *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)input_file);
  std::__cxx11::string::string((string *)&this->output_file_name_);
  std::unique_ptr<mkvparser::Segment,std::default_delete<mkvparser::Segment>>::
  unique_ptr<std::default_delete<mkvparser::Segment>,void>
            ((unique_ptr<mkvparser::Segment,std::default_delete<mkvparser::Segment>> *)
             &this->webm_parser_);
  mkvparser::MkvReader::MkvReader(&this->webm_reader_);
  std::unique_ptr<_IO_FILE,libwebm::FILEDeleter>::unique_ptr<libwebm::FILEDeleter,void>
            ((unique_ptr<_IO_FILE,libwebm::FILEDeleter> *)&this->output_file_);
  this->video_track_num_ = 0;
  this->timecode_scale_ = 1000000;
  this->packet_sink_ = packet_sink;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->packet_data_);
  this->bytes_written_ = 0;
  return;
}

Assistant:

Webm2Pes(const std::string& input_file, PacketReceiverInterface* packet_sink)
      : input_file_name_(input_file), packet_sink_(packet_sink) {}